

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::cpp::(anonymous_namespace)::
GenerateConditionMaybeWithProbability_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,uint32_t mask,
          optional<float> probability,bool use_cached_has_bits,optional<int> has_array_index)

{
  uint in_register_00000014;
  _Alloc_hider _Var1;
  uint7 in_register_00000081;
  UntypedFormatSpecImpl format;
  UntypedFormatSpecImpl format_00;
  UntypedFormatSpecImpl format_01;
  Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> args;
  Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> args_00;
  Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> args_01;
  string condition;
  _Alloc_hider local_88;
  size_type local_80;
  char local_78;
  undefined7 uStack_77;
  undefined8 uStack_70;
  undefined1 local_68 [32];
  string local_48;
  
  local_80 = 0;
  local_78 = '\0';
  local_88._M_p = &local_78;
  if (probability.super__Optional_base<float,_true,_true>._M_payload.
      super__Optional_payload_base<float>._M_payload == (_Storage<float,_true>)0x0) {
    if ((in_register_00000081 & 0x1000000) == 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_68,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/message.cc"
                 ,0x83,"has_array_index.has_value()");
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)local_68);
    }
    local_68._0_8_ = CONCAT71(in_register_00000081,use_cached_has_bits) & 0xffffffff;
    local_68._8_8_ = absl::lts_20250127::str_format_internal::FormatArgImpl::Dispatch<int>;
    local_68._16_8_ = (ulong)this & 0xffffffff;
    local_68._24_8_ = absl::lts_20250127::str_format_internal::FormatArgImpl::Dispatch<unsigned_int>
    ;
    format_00.size_ = (size_t)local_68;
    format_00.data_ = &DAT_0000002c;
    args_00.len_ = (size_type)
                   has_array_index.super__Optional_base<int,_true,_true>._M_payload.
                   super__Optional_payload_base<int>;
    args_00.ptr_ = (pointer)0x2;
    absl::lts_20250127::str_format_internal::FormatPack_abi_cxx11_
              (&local_48,(str_format_internal *)"(this_._impl_._has_bits_[%d] & 0x%08xu) != 0",
               format_00,args_00);
    std::__cxx11::string::operator=((string *)&local_88,(string *)&local_48);
    _Var1._M_p = local_48._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p == &local_48.field_2) goto LAB_00dec3f4;
  }
  else {
    local_48._M_dataplus._M_p = (pointer)((ulong)this & 0xffffffff);
    local_48._M_string_length =
         (size_type)absl::lts_20250127::str_format_internal::FormatArgImpl::Dispatch<unsigned_int>;
    format.size_ = (size_t)&local_48;
    format.data_ = &DAT_00000020;
    args.len_ = (size_type)
                has_array_index.super__Optional_base<int,_true,_true>._M_payload.
                super__Optional_payload_base<int>;
    args.ptr_ = (pointer)0x1;
    absl::lts_20250127::str_format_internal::FormatPack_abi_cxx11_
              ((string *)local_68,(str_format_internal *)"(cached_has_bits & 0x%08xu) != 0",format,
               args);
    std::__cxx11::string::operator=((string *)&local_88,(string *)local_68);
    local_48.field_2._M_allocated_capacity = local_68._16_8_;
    _Var1._M_p = (pointer)local_68._0_8_;
    if ((undefined1 *)local_68._0_8_ == local_68 + 0x10) goto LAB_00dec3f4;
  }
  operator_delete(_Var1._M_p,local_48.field_2._M_allocated_capacity + 1);
LAB_00dec3f4:
  if ((in_register_00000014 & 1) == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (local_88._M_p == &local_78) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_77,local_78);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_70;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_88._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_77,local_78);
    }
    __return_storage_ptr__->_M_string_length = local_80;
    local_80 = 0;
    local_78 = '\0';
    local_88._M_p = &local_78;
  }
  else {
    local_68._8_8_ =
         absl::lts_20250127::str_format_internal::FormatArgImpl::Dispatch<std::__cxx11::string>;
    local_68._16_8_ = ZEXT48(mask);
    local_68._24_8_ = absl::lts_20250127::str_format_internal::FormatArgImpl::Dispatch<float>;
    format_01.size_ = (size_t)local_68;
    format_01.data_ = &DAT_0000002f;
    args_01.len_._0_4_ =
         has_array_index.super__Optional_base<int,_true,_true>._M_payload.
         super__Optional_payload_base<int>._M_payload;
    args_01.len_._4_1_ =
         has_array_index.super__Optional_base<int,_true,_true>._M_payload.
         super__Optional_payload_base<int>._M_engaged;
    args_01.len_._5_3_ =
         has_array_index.super__Optional_base<int,_true,_true>._M_payload.
         super__Optional_payload_base<int>._5_3_;
    args_01.ptr_ = (pointer)0x2;
    local_68._0_8_ = &local_88;
    absl::lts_20250127::str_format_internal::FormatPack_abi_cxx11_
              (__return_storage_ptr__,
               (str_format_internal *)"PROTOBUF_EXPECT_TRUE_WITH_PROBABILITY(%s, %.3f)",format_01,
               args_01);
  }
  if (local_88._M_p != &local_78) {
    operator_delete(local_88._M_p,CONCAT71(uStack_77,local_78) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenerateConditionMaybeWithProbability(
    uint32_t mask, absl::optional<float> probability, bool use_cached_has_bits,
    absl::optional<int> has_array_index) {
  std::string condition;
  if (use_cached_has_bits) {
    condition = absl::StrFormat("(cached_has_bits & 0x%08xu) != 0", mask);
  } else {
    // We only use has_array_index when use_cached_has_bits is false, make sure
    // we pas a valid index when we need it.
    ABSL_DCHECK(has_array_index.has_value());
    condition = absl::StrFormat("(this_._impl_._has_bits_[%d] & 0x%08xu) != 0",
                                *has_array_index, mask);
  }
  if (probability.has_value()) {
    return absl::StrFormat("PROTOBUF_EXPECT_TRUE_WITH_PROBABILITY(%s, %.3f)",
                           condition, *probability);
  }
  return condition;
}